

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beziervolume.cpp
# Opt level: O1

bool __thiscall ON_BezierCageMorph::Write(ON_BezierCageMorph *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(archive,0x40008000,1,0);
  if (bVar1) {
    bVar2 = ON_BinaryArchive::WriteXform(archive,&this->m_xyz2rst);
    if (bVar2) {
      bVar2 = ON_BezierCage::Write(&this->m_rst2xyz,archive);
    }
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(archive);
    bVar1 = (bool)(bVar1 & bVar2);
  }
  return bVar1;
}

Assistant:

bool ON_BezierCageMorph::Write(ON_BinaryArchive& archive) const
{
  bool rc = archive.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,0);
  if (rc)
  {
    if (rc)
      rc = archive.WriteXform(m_xyz2rst);
    if(rc)
      rc = m_rst2xyz.Write(archive);
    if ( !archive.EndWrite3dmChunk() )
      rc = false;
  }
  return rc;
}